

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

BucketWidthType __thiscall
duckdb::TimeBucket::ClassifyBucketWidthErrorThrow(TimeBucket *this,interval_t bucket_width)

{
  BucketWidthType BVar1;
  NotImplementedException *pNVar2;
  int64_t iVar3;
  allocator local_49;
  string local_48;
  interval_t bucket_width_local;
  
  bucket_width_local.micros = bucket_width._0_8_;
  bucket_width_local._0_8_ = this;
  if ((int)this == 0) {
    iVar3 = Interval::GetMicro(&bucket_width_local);
    if (iVar3 < 1) {
      pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_48,"Period must be greater than 0",&local_49);
      NotImplementedException::NotImplementedException(pNVar2,&local_48);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    BVar1 = CONVERTIBLE_TO_MICROS;
  }
  else {
    if (((ulong)this >> 0x20 != 0) || (bucket_width_local.micros != 0)) {
      pNVar2 = (NotImplementedException *)
               __cxa_allocate_exception(0x10,bucket_width_local.micros,bucket_width.micros);
      ::std::__cxx11::string::string
                ((string *)&local_48,"Month intervals cannot have day or time component",&local_49);
      NotImplementedException::NotImplementedException(pNVar2,&local_48);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    BVar1 = CONVERTIBLE_TO_MONTHS;
    if ((int)this < 0) {
      pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10,0,bucket_width.micros);
      ::std::__cxx11::string::string((string *)&local_48,"Period must be greater than 0",&local_49);
      NotImplementedException::NotImplementedException(pNVar2,&local_48);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return BVar1;
}

Assistant:

static inline BucketWidthType ClassifyBucketWidthErrorThrow(const interval_t bucket_width) {
		if (bucket_width.months == 0) {
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			if (bucket_width_micros <= 0) {
				throw NotImplementedException("Period must be greater than 0");
			}
			return BucketWidthType::CONVERTIBLE_TO_MICROS;
		} else if (bucket_width.months != 0 && bucket_width.days == 0 && bucket_width.micros == 0) {
			if (bucket_width.months < 0) {
				throw NotImplementedException("Period must be greater than 0");
			}
			return BucketWidthType::CONVERTIBLE_TO_MONTHS;
		} else {
			throw NotImplementedException("Month intervals cannot have day or time component");
		}
	}